

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O3

void ihevc_inter_pred_luma_horz_w16out
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  short sVar5;
  long lVar6;
  
  if (0 < ht) {
    iVar2 = 0;
    do {
      if (0 < wd) {
        lVar1 = -0x300000000;
        uVar3 = 0;
        do {
          lVar4 = 0;
          sVar5 = 0;
          lVar6 = lVar1;
          do {
            sVar5 = sVar5 + (ushort)pu1_src[lVar6 >> 0x20] * (short)pi1_coeff[lVar4];
            lVar4 = lVar4 + 1;
            lVar6 = lVar6 + 0x100000000;
          } while (lVar4 != 8);
          pi2_dst[uVar3] = sVar5;
          uVar3 = uVar3 + 1;
          lVar1 = lVar1 + 0x100000000;
        } while (uVar3 != (uint)wd);
      }
      pu1_src = pu1_src + src_strd;
      pi2_dst = pi2_dst + dst_strd;
      iVar2 = iVar2 + 1;
    } while (iVar2 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_horz_w16out(UWORD8 *pu1_src,
                                       WORD16 *pi2_dst,
                                       WORD32 src_strd,
                                       WORD32 dst_strd,
                                       WORD8 *pi1_coeff,
                                       WORD32 ht,
                                       WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i2_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i2_tmp += pi1_coeff[i] * pu1_src[col + (i - 3)];

            pi2_dst[col] = i2_tmp;
        }

        pu1_src += src_strd;
        pi2_dst += dst_strd;
    }

}